

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O3

int oonf_layer2_data_parse_string(oonf_layer2_value *value,oonf_layer2_metadata *meta,char *input)

{
  int iVar1;
  int iVar2;
  
  value->integer = 0;
  ((uint8_t *)value)[8] = '\0';
  ((uint8_t *)value)[9] = '\0';
  ((uint8_t *)value)[10] = '\0';
  ((uint8_t *)value)[0xb] = '\0';
  ((uint8_t *)value)[0xc] = '\0';
  ((uint8_t *)value)[0xd] = '\0';
  ((uint8_t *)value)[0xe] = '\0';
  ((uint8_t *)value)[0xf] = '\0';
  *(undefined8 *)&(value->addr)._type = 0;
  iVar1 = -1;
  if (meta->type == OONF_LAYER2_BOOLEAN_DATA) {
    iVar2 = cfg_get_choice_index(input,cfg_get_choice_array_value,8,CFGLIST_BOOL);
    if (-1 < iVar2) {
      iVar1 = cfg_get_choice_index(input,cfg_get_choice_array_value,4,CFGLIST_BOOL_TRUE);
      value->boolean = -1 < iVar1;
      iVar1 = 0;
    }
  }
  else if (meta->type == OONF_LAYER2_INTEGER_DATA) {
    iVar1 = isonumber_to_s64(&value->integer,input,meta->scaling);
    return iVar1;
  }
  return iVar1;
}

Assistant:

int
oonf_layer2_data_parse_string(
  union oonf_layer2_value *value, const struct oonf_layer2_metadata *meta, const char *input) {
  memset(value, 0, sizeof(*value));

  switch (meta->type) {
    case OONF_LAYER2_INTEGER_DATA:
      return isonumber_to_s64(&value->integer, input, meta->scaling);

    case OONF_LAYER2_BOOLEAN_DATA:
      if (!cfg_is_bool(input)) {
        return -1;
      }
      value->boolean = cfg_get_bool(input);
      return 0;

    default:
      return -1;
  }
}